

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_cvc.c
# Opt level: O1

err_t cmdCVCsFind(size_t *offset,octet *certs,size_t certs_len,octet *cert,size_t cert_len)

{
  bool bVar1;
  bool_t bVar2;
  size_t sVar3;
  err_t unaff_EBP;
  size_t pos;
  size_t sVar4;
  
  sVar4 = 0;
  do {
    if (certs_len == 0) {
      return 0x70;
    }
    sVar3 = btokCVCLen(certs,certs_len);
    if (sVar3 == 0xffffffffffffffff) {
      unaff_EBP = 0x204;
LAB_00103ab8:
      bVar1 = false;
    }
    else {
      if ((sVar3 == cert_len) && (bVar2 = memEq(certs,cert,cert_len), bVar2 != 0)) {
        if (offset != (size_t *)0x0) {
          *offset = sVar4;
        }
        unaff_EBP = 0;
        goto LAB_00103ab8;
      }
      sVar4 = sVar4 + sVar3;
      certs = certs + sVar3;
      certs_len = certs_len - sVar3;
      bVar1 = true;
    }
    if (!bVar1) {
      return unaff_EBP;
    }
  } while( true );
}

Assistant:

err_t cmdCVCsFind(size_t* offset, const octet* certs, size_t certs_len,
	const octet* cert, size_t cert_len)
{
	size_t pos;
	// pre
	ASSERT(memIsValid(certs, certs_len));
	ASSERT(memIsValid(cert, cert_len));
	ASSERT(memIsNullOrValid(offset, O_PER_S));
	// цикл по сертификатам
	for (pos = 0; certs_len; )
	{
		size_t len = btokCVCLen(certs, certs_len);
		if (len == SIZE_MAX)
			return ERR_BAD_CERTRING;
		if (len == cert_len && memEq(certs, cert, cert_len))
		{
			if (offset)
				*offset = pos;
			return ERR_OK;
		}
		pos += len, certs += len, certs_len -= len;
	}
	return ERR_NOT_FOUND;
}